

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow *window,ImVec2 *size_desired)

{
  ImGuiSizeCallback p_Var1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  ImGuiWindow *window_for_height;
  uint uVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float local_48;
  float fStack_44;
  ImGuiSizeCallbackData local_38;
  
  pIVar2 = GImGui;
  fVar4 = SUB84(size_desired,0);
  if (((GImGui->NextWindowData).Flags & 0x10) != 0) {
    fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Min.x;
    fVar8 = (GImGui->NextWindowData).SizeConstraintRect.Min.y;
    if ((fVar7 < 0.0) || (fVar5 = (GImGui->NextWindowData).SizeConstraintRect.Max.x, fVar5 < 0.0)) {
      fVar4 = (window->SizeFull).x;
    }
    else {
      if (fVar4 <= fVar5) {
        fVar5 = fVar4;
      }
      fVar4 = (float)(-(uint)(fVar4 < fVar7) & (uint)fVar7 | ~-(uint)(fVar4 < fVar7) & (uint)fVar5);
    }
    if ((fVar8 < 0.0) || (fVar7 = (GImGui->NextWindowData).SizeConstraintRect.Max.y, fVar7 < 0.0)) {
      fVar7 = (window->SizeFull).y;
    }
    else {
      fVar5 = (float)((ulong)size_desired >> 0x20);
      if (fVar5 <= fVar7) {
        fVar7 = fVar5;
      }
      fVar7 = (float)(-(uint)(fVar5 < fVar8) & (uint)fVar8 | ~-(uint)(fVar5 < fVar8) & (uint)fVar7);
    }
    IVar6.y = fVar7;
    IVar6.x = fVar4;
    p_Var1 = (GImGui->NextWindowData).SizeCallback;
    if (p_Var1 != (ImGuiSizeCallback)0x0) {
      local_38.UserData = (GImGui->NextWindowData).SizeCallbackUserData;
      local_38.Pos = window->Pos;
      local_38.CurrentSize = window->SizeFull;
      local_38.DesiredSize = IVar6;
      (*p_Var1)(&local_38);
      IVar6 = local_38.DesiredSize;
    }
    size_desired._0_4_ = (float)(int)IVar6.x;
    size_desired._4_4_ = (float)(int)IVar6.y;
  }
  if ((window->Flags & 0x1000040U) == 0) {
    fVar4 = 0.0;
    if ((window->Flags & 1U) == 0) {
      fVar4 = GImGui->FontBaseSize * window->FontWindowScale;
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        fVar4 = fVar4 * window->ParentWindow->FontWindowScale;
      }
      fVar7 = (GImGui->Style).FramePadding.y;
      fVar4 = fVar7 + fVar7 + fVar4;
    }
    fVar5 = ImGuiWindow::MenuBarHeight(window);
    local_48 = SUB84(size_desired,0);
    fStack_44 = SUB84(size_desired,4);
    fVar7 = (pIVar2->Style).WindowMinSize.x;
    fVar8 = (pIVar2->Style).WindowMinSize.y;
    uVar3 = -(uint)(fVar7 <= local_48);
    size_desired._0_4_ = (float)(~uVar3 & (uint)fVar7 | (uint)local_48 & uVar3);
    uVar3 = -(uint)(fVar8 <= fStack_44);
    fVar8 = (float)(~uVar3 & (uint)fVar8 | (uint)fStack_44 & uVar3);
    fVar7 = (pIVar2->Style).WindowRounding + -1.0;
    fVar4 = (float)(~-(uint)(fVar7 <= 0.0) & (uint)fVar7) + fVar5 + fVar4;
    uVar3 = -(uint)(fVar4 <= fVar8);
    size_desired._4_4_ = (float)(~uVar3 & (uint)fVar4 | uVar3 & (uint)fVar8);
  }
  return (ImVec2)size_desired;
}

Assistant:

static ImVec2 CalcWindowSizeAfterConstraint(ImGuiWindow* window, const ImVec2& size_desired)
{
    ImGuiContext& g = *GImGui;
    ImVec2 new_size = size_desired;
    if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint)
    {
        // Using -1,-1 on either X/Y axis to preserve the current size.
        ImRect cr = g.NextWindowData.SizeConstraintRect;
        new_size.x = (cr.Min.x >= 0 && cr.Max.x >= 0) ? ImClamp(new_size.x, cr.Min.x, cr.Max.x) : window->SizeFull.x;
        new_size.y = (cr.Min.y >= 0 && cr.Max.y >= 0) ? ImClamp(new_size.y, cr.Min.y, cr.Max.y) : window->SizeFull.y;
        if (g.NextWindowData.SizeCallback)
        {
            ImGuiSizeCallbackData data;
            data.UserData = g.NextWindowData.SizeCallbackUserData;
            data.Pos = window->Pos;
            data.CurrentSize = window->SizeFull;
            data.DesiredSize = new_size;
            g.NextWindowData.SizeCallback(&data);
            new_size = data.DesiredSize;
        }
        new_size.x = IM_FLOOR(new_size.x);
        new_size.y = IM_FLOOR(new_size.y);
    }

    // Minimum size
    if (!(window->Flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_AlwaysAutoResize)))
    {
        ImGuiWindow* window_for_height = window;
        const float decoration_up_height = window_for_height->TitleBarHeight() + window_for_height->MenuBarHeight();
        new_size = ImMax(new_size, g.Style.WindowMinSize);
        new_size.y = ImMax(new_size.y, decoration_up_height + ImMax(0.0f, g.Style.WindowRounding - 1.0f)); // Reduce artifacts with very small windows
    }
    return new_size;
}